

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream *
QtPrivate::readAssociativeContainer<QHash<QFont::Tag,unsigned_int>>
          (QDataStream *s,QHash<QFont::Tag,_unsigned_int> *c)

{
  qint64 qVar1;
  long in_FS_OFFSET;
  bool bVar2;
  mapped_type_conflict1 t;
  Tag local_4c;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_48,s);
  QHash<QFont::Tag,_unsigned_int>::clear(c);
  qVar1 = QDataStream::readQSizeType(s);
  if (qVar1 < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    while (bVar2 = qVar1 != 0, qVar1 = qVar1 + -1, bVar2) {
      local_4c.m_value = 0;
      t = 0xaaaaaaaa;
      ::operator>>(s,&local_4c);
      QDataStream::operator>>(s,(int *)&t);
      if (s[0x13] != (QDataStream)0x0) {
        QHash<QFont::Tag,_unsigned_int>::clear(c);
        break;
      }
      QHash<QFont::Tag,unsigned_int>::emplace<unsigned_int_const&>
                ((QHash<QFont::Tag,unsigned_int> *)c,&local_4c,&t);
    }
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readAssociativeContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::key_type k;
        typename Container::mapped_type t;
        s >> k >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.insert(k, t);
    }

    return s;
}